

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

function<int_()> * __thiscall
cmake::BuildWorkflowStep
          (function<int_()> *__return_storage_ptr__,cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmUVProcessChainBuilder *pcVar1;
  cmUVProcessChainBuilder local_f0;
  undefined1 local_80 [8];
  cmUVProcessChainBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  builder.Loop = (uv_loop_t *)args;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_80);
  pcVar1 = cmUVProcessChainBuilder::AddCommand
                     ((cmUVProcessChainBuilder *)local_80,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)builder.Loop);
  pcVar1 = cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_OUTPUT,_stdout);
  cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_ERROR,_stderr);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_f0,(cmUVProcessChainBuilder *)local_80);
  std::function<int()>::
  function<cmake::BuildWorkflowStep(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
            ((function<int()> *)__return_storage_ptr__,(anon_class_96_1_911e227b *)&local_f0);
  BuildWorkflowStep(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
  $_0::~__0((__0 *)&local_f0);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_80);
  return __return_storage_ptr__;
}

Assistant:

std::function<int()> cmake::BuildWorkflowStep(
  const std::vector<std::string>& args)
{
  cmUVProcessChainBuilder builder;
  builder.AddCommand(args)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  return [builder]() -> int {
    auto chain = builder.Start();
    chain.Wait();
    return static_cast<int>(chain.GetStatus(0).ExitStatus);
  };
}